

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtVarsAreSymmetric(word *pTruth,int nVars,int i,int j,word *pCof0,word *pCof1)

{
  word wVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  word *pwVar5;
  uint uVar6;
  uint uVar7;
  word *pwVar8;
  int iVar9;
  ulong uVar10;
  word *pwVar11;
  ulong uVar12;
  
  uVar4 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar4 = 1;
  }
  if ((i < nVars) && (j < nVars)) {
    bVar2 = (byte)i;
    bVar3 = (byte)j;
    if (uVar4 == 1) {
      bVar2 = (byte)(1 << (bVar2 & 0x1f));
      *pCof0 = (s_Truths6Neg[i] & *pTruth) << (bVar2 & 0x3f) | s_Truths6Neg[i] & *pTruth;
      *pCof1 = (s_Truths6[i] & *pTruth) >> (bVar2 & 0x3f) | s_Truths6[i] & *pTruth;
      bVar3 = (byte)(1 << (bVar3 & 0x1f));
      *pCof0 = (s_Truths6[j] & *pCof0) >> (bVar3 & 0x3f) | s_Truths6[j] & *pCof0;
      *pCof1 = (s_Truths6Neg[j] & *pCof1) << (bVar3 & 0x3f) | s_Truths6Neg[j] & *pCof1;
    }
    else {
      if (i < 6) {
        uVar10 = 0;
        uVar12 = 0;
        if (0 < (int)uVar4) {
          uVar12 = (ulong)uVar4;
        }
        for (; uVar12 != uVar10; uVar10 = uVar10 + 1) {
          pCof0[uVar10] =
               (s_Truths6Neg[i] & pTruth[uVar10]) << ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
               s_Truths6Neg[i] & pTruth[uVar10];
        }
      }
      else {
        uVar7 = 1 << (bVar2 - 6 & 0x1f);
        iVar9 = 2 << (bVar2 - 6 & 0x1f);
        uVar6 = 0;
        if (0 < (int)uVar7) {
          uVar6 = uVar7;
        }
        pwVar8 = pCof0 + (int)uVar7;
        pwVar11 = pCof0;
        for (pwVar5 = pTruth; pwVar5 < pTruth + (int)uVar4; pwVar5 = pwVar5 + iVar9) {
          for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
            wVar1 = pwVar5[uVar10];
            pwVar11[uVar10] = wVar1;
            pwVar8[uVar10] = wVar1;
          }
          pwVar8 = pwVar8 + iVar9;
          pwVar11 = pwVar11 + iVar9;
        }
      }
      if (i < 6) {
        uVar10 = 0;
        uVar12 = 0;
        if (0 < (int)uVar4) {
          uVar12 = (ulong)uVar4;
        }
        for (; uVar12 != uVar10; uVar10 = uVar10 + 1) {
          pCof1[uVar10] =
               (s_Truths6[i] & pTruth[uVar10]) >> ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
               s_Truths6[i] & pTruth[uVar10];
        }
      }
      else {
        uVar6 = 1 << (bVar2 - 6 & 0x1f);
        pwVar8 = pTruth + (int)uVar4;
        iVar9 = 2 << (bVar2 - 6 & 0x1f);
        uVar10 = 0;
        if (0 < (int)uVar6) {
          uVar10 = (ulong)uVar6;
        }
        pwVar5 = pCof1;
        for (; pTruth < pwVar8; pTruth = pTruth + iVar9) {
          for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
            wVar1 = pTruth[(long)(int)uVar6 + uVar12];
            pwVar5[uVar12] = wVar1;
            pwVar5[(long)(int)uVar6 + uVar12] = wVar1;
          }
          pwVar5 = pwVar5 + iVar9;
        }
      }
      if (j < 6) {
        uVar10 = 0;
        uVar12 = 0;
        if (0 < (int)uVar4) {
          uVar12 = (ulong)uVar4;
        }
        for (; uVar12 != uVar10; uVar10 = uVar10 + 1) {
          pCof0[uVar10] =
               (s_Truths6[j] & pCof0[uVar10]) >> ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) |
               s_Truths6[j] & pCof0[uVar10];
        }
      }
      else {
        bVar2 = bVar3 - 6 & 0x1f;
        uVar7 = 1 << bVar2;
        uVar6 = 0 << bVar2;
        if (0 < (int)uVar7) {
          uVar6 = uVar7;
        }
        for (pwVar8 = pCof0; pwVar8 < pCof0 + (int)uVar4;
            pwVar8 = pwVar8 + (2 << (bVar3 - 6 & 0x1f))) {
          for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
            pwVar8[uVar10] = pwVar8[(long)(int)uVar7 + uVar10];
          }
        }
      }
      if (j < 6) {
        uVar10 = 0;
        uVar12 = 0;
        if (0 < (int)uVar4) {
          uVar12 = (ulong)uVar4;
        }
        for (; uVar12 != uVar10; uVar10 = uVar10 + 1) {
          pCof1[uVar10] =
               (s_Truths6Neg[j] & pCof1[uVar10]) << ((byte)(1 << (bVar3 & 0x1f)) & 0x3f) |
               s_Truths6Neg[j] & pCof1[uVar10];
        }
      }
      else {
        uVar6 = 1 << (bVar3 - 6 & 0x1f);
        iVar9 = 2 << (bVar3 - 6 & 0x1f);
        uVar10 = 0;
        if (0 < (int)uVar6) {
          uVar10 = (ulong)uVar6;
        }
        pwVar8 = pCof1 + (int)uVar6;
        for (pwVar5 = pCof1; pwVar5 < pCof1 + (int)uVar4; pwVar5 = pwVar5 + iVar9) {
          for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
            pwVar8[uVar12] = pwVar5[uVar12];
          }
          pwVar8 = pwVar8 + iVar9;
        }
      }
    }
    uVar10 = 0;
    uVar12 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar12 = uVar10;
    }
    do {
      if (uVar12 == uVar10) {
        return 1;
      }
      pwVar8 = pCof0 + uVar10;
      pwVar5 = pCof1 + uVar10;
      uVar10 = uVar10 + 1;
    } while (*pwVar8 == *pwVar5);
    return 0;
  }
  __assert_fail("i < nVars && j < nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0xd5e,"int Abc_TtVarsAreSymmetric(word *, int, int, int, word *, word *)");
}

Assistant:

static inline int Abc_TtVarsAreSymmetric( word * pTruth, int nVars, int i, int j, word * pCof0, word * pCof1 )
{
    int nWords = Abc_TtWordNum( nVars );
    assert( i < nVars && j < nVars );
    Abc_TtCofactor0p( pCof0, pTruth, nWords, i );
    Abc_TtCofactor1p( pCof1, pTruth, nWords, i );
    Abc_TtCofactor1( pCof0, nWords, j );
    Abc_TtCofactor0( pCof1, nWords, j );
    return Abc_TtEqual( pCof0, pCof1, nWords );
}